

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageReadWrite
          (ValidationState_t *_,Instruction *inst,ImageTypeInfo *info)

{
  bool bVar1;
  Dim DVar2;
  uint32_t uVar3;
  long lVar4;
  char *pcVar5;
  DiagnosticStream DStack_1f8;
  
  if (info->sampled == 0) {
    return SPV_SUCCESS;
  }
  if (info->sampled == 2) {
    DVar2 = info->dim;
    if (DVar2 == Dim1D) {
      bVar1 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityImage1D);
      if (!bVar1) {
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar5 = "Capability Image1D is required to access storage image";
        lVar4 = 0x36;
        goto LAB_00675bd3;
      }
      DVar2 = info->dim;
    }
    if (DVar2 == DimRect) {
      bVar1 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityImageRect);
      if (!bVar1) {
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar5 = "Capability ImageRect is required to access storage image";
        lVar4 = 0x38;
        goto LAB_00675bd3;
      }
      DVar2 = info->dim;
    }
    if (DVar2 == Buffer) {
      bVar1 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityImageBuffer);
      if (!bVar1) {
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar5 = "Capability ImageBuffer is required to access storage image";
        lVar4 = 0x3a;
        goto LAB_00675bd3;
      }
      DVar2 = info->dim;
    }
    uVar3 = info->arrayed;
    if (uVar3 == 1 && DVar2 == Cube) {
      bVar1 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityImageCubeArray);
      if (!bVar1) {
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&DStack_1f8,"Capability ImageCubeArray is required to access ",0x30);
        pcVar5 = "storage image";
        lVar4 = 0xd;
        goto LAB_00675bd3;
      }
      uVar3 = info->arrayed;
    }
    if (info->multisampled != 1) {
      return SPV_SUCCESS;
    }
    if (uVar3 != 1) {
      return SPV_SUCCESS;
    }
    if (info->sampled != 2) {
      return SPV_SUCCESS;
    }
    bVar1 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityImageMSArray);
    if (bVar1) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&DStack_1f8,"Capability ImageMSArray is required to access storage ",0x36)
    ;
    pcVar5 = "image";
    lVar4 = 5;
  }
  else {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar5 = "Expected Image \'Sampled\' parameter to be 0 or 2";
    lVar4 = 0x2f;
  }
LAB_00675bd3:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar5,lVar4);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateImageReadWrite(ValidationState_t& _,
                                    const Instruction* inst,
                                    const ImageTypeInfo& info) {
  if (info.sampled == 2) {
    if (info.dim == spv::Dim::Dim1D &&
        !_.HasCapability(spv::Capability::Image1D)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability Image1D is required to access storage image";
    } else if (info.dim == spv::Dim::Rect &&
               !_.HasCapability(spv::Capability::ImageRect)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability ImageRect is required to access storage image";
    } else if (info.dim == spv::Dim::Buffer &&
               !_.HasCapability(spv::Capability::ImageBuffer)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability ImageBuffer is required to access storage image";
    } else if (info.dim == spv::Dim::Cube && info.arrayed == 1 &&
               !_.HasCapability(spv::Capability::ImageCubeArray)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability ImageCubeArray is required to access "
             << "storage image";
    }

    if (info.multisampled == 1 && info.arrayed == 1 && info.sampled == 2 &&
        !_.HasCapability(spv::Capability::ImageMSArray)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability ImageMSArray is required to access storage "
             << "image";
    }
  } else if (info.sampled != 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image 'Sampled' parameter to be 0 or 2";
  }

  return SPV_SUCCESS;
}